

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void SobelRow_SSE2(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_argb,int width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  unkbyte10 Var8;
  int iVar9;
  long lVar10;
  undefined4 uVar11;
  undefined1 auVar16 [16];
  undefined2 uVar19;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined6 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  undefined1 auVar17 [16];
  undefined2 uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  lVar10 = (long)src_sobely - (long)src_sobelx;
  do {
    auVar16 = *(undefined1 (*) [16])src_sobelx;
    pauVar1 = (undefined1 (*) [16])((long)src_sobelx + lVar10);
    src_sobelx = (uint8_t *)((long)src_sobelx + 0x10);
    auVar16 = paddusb(auVar16,*pauVar1);
    auVar32._0_14_ = auVar16._0_14_;
    auVar32[0xe] = auVar16[7];
    auVar32[0xf] = auVar16[7];
    auVar31._14_2_ = auVar32._14_2_;
    auVar31._0_13_ = auVar16._0_13_;
    auVar31[0xd] = auVar16[6];
    auVar30._13_3_ = auVar31._13_3_;
    auVar30._0_12_ = auVar16._0_12_;
    auVar30[0xc] = auVar16[6];
    auVar29._12_4_ = auVar30._12_4_;
    auVar29._0_11_ = auVar16._0_11_;
    auVar29[0xb] = auVar16[5];
    auVar28._11_5_ = auVar29._11_5_;
    auVar28._0_10_ = auVar16._0_10_;
    auVar28[10] = auVar16[5];
    auVar27._10_6_ = auVar28._10_6_;
    auVar27._0_9_ = auVar16._0_9_;
    auVar27[9] = auVar16[4];
    auVar26._9_7_ = auVar27._9_7_;
    auVar26._0_8_ = auVar16._0_8_;
    auVar26[8] = auVar16[4];
    Var8 = CONCAT91(CONCAT81(auVar26._8_8_,auVar16[3]),auVar16[3]);
    auVar7._2_10_ = Var8;
    auVar7[1] = auVar16[2];
    auVar7[0] = auVar16[2];
    auVar6._2_12_ = auVar7;
    auVar6[1] = auVar16[1];
    auVar6[0] = auVar16[1];
    auVar25._0_2_ = CONCAT11(auVar16[0],auVar16[0]);
    auVar25._2_14_ = auVar6;
    uVar20 = CONCAT11(auVar16[8],auVar16[8]);
    uVar11 = CONCAT13(auVar16[9],CONCAT12(auVar16[9],uVar20));
    uVar12 = CONCAT15(auVar16[10],CONCAT14(auVar16[10],uVar11));
    uVar13 = CONCAT17(auVar16[0xb],CONCAT16(auVar16[0xb],uVar12));
    auVar14._0_10_ = CONCAT19(auVar16[0xc],CONCAT18(auVar16[0xc],uVar13));
    auVar14[10] = auVar16[0xd];
    auVar14[0xb] = auVar16[0xd];
    auVar15[0xc] = auVar16[0xe];
    auVar15._0_12_ = auVar14;
    auVar15[0xd] = auVar16[0xe];
    auVar17[0xf] = auVar16[0xf];
    auVar17[0xe] = auVar17[0xf];
    auVar17._0_14_ = auVar15;
    uVar19 = (undefined2)Var8;
    auVar24._0_12_ = auVar25._0_12_;
    auVar24._12_2_ = uVar19;
    auVar24._14_2_ = uVar19;
    auVar23._12_4_ = auVar24._12_4_;
    auVar23._0_10_ = auVar25._0_10_;
    auVar23._10_2_ = auVar7._0_2_;
    auVar22._10_6_ = auVar23._10_6_;
    auVar22._0_8_ = auVar25._0_8_;
    auVar22._8_2_ = auVar7._0_2_;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._6_2_ = auVar6._0_2_;
    auVar21._4_2_ = auVar6._0_2_;
    auVar21._2_2_ = auVar25._0_2_;
    auVar21._0_2_ = auVar25._0_2_;
    auVar33._2_2_ = auVar26._8_2_;
    auVar33._0_2_ = auVar26._8_2_;
    auVar33._4_2_ = auVar28._10_2_;
    auVar33._6_2_ = auVar28._10_2_;
    auVar33._8_2_ = auVar30._12_2_;
    auVar33._10_2_ = auVar30._12_2_;
    auVar33._12_2_ = auVar31._14_2_;
    auVar33._14_2_ = auVar31._14_2_;
    auVar16[0xb] = 0xff;
    auVar16._0_11_ = ZEXT811(0xff000000ff000000);
    auVar16._12_3_ = 0;
    auVar16[0xf] = 0xff;
    auVar3[0xb] = 0xff;
    auVar3._0_11_ = ZEXT811(0xff000000ff000000);
    auVar3._12_3_ = 0;
    auVar3[0xf] = 0xff;
    uVar19 = (undefined2)((ulong)uVar13 >> 0x30);
    auVar39._12_2_ = uVar19;
    auVar39._0_12_ = auVar14;
    auVar39._14_2_ = uVar19;
    uVar19 = (undefined2)((uint6)uVar12 >> 0x20);
    auVar38._12_4_ = auVar39._12_4_;
    auVar38._10_2_ = uVar19;
    auVar38._0_10_ = auVar14._0_10_;
    auVar37._10_6_ = auVar38._10_6_;
    auVar37._8_2_ = uVar19;
    auVar37._0_8_ = uVar13;
    uVar19 = (undefined2)((uint)uVar11 >> 0x10);
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._6_2_ = uVar19;
    auVar36._0_6_ = uVar12;
    auVar35._6_10_ = auVar36._6_10_;
    auVar35._4_2_ = uVar19;
    auVar35._0_4_ = uVar11;
    auVar34._4_12_ = auVar35._4_12_;
    auVar34._2_2_ = uVar20;
    auVar34._0_2_ = uVar20;
    uVar20 = (undefined2)((unkuint10)auVar14._0_10_ >> 0x40);
    auVar18._2_2_ = uVar20;
    auVar18._0_2_ = uVar20;
    auVar18._4_2_ = auVar14._10_2_;
    auVar18._6_2_ = auVar14._10_2_;
    auVar18._8_2_ = auVar15._12_2_;
    auVar18._10_2_ = auVar15._12_2_;
    auVar18._14_2_ = auVar17._14_2_;
    auVar18._12_2_ = auVar18._14_2_;
    auVar4[0xb] = 0xff;
    auVar4._0_11_ = ZEXT811(0xff000000ff000000);
    auVar4._12_3_ = 0;
    auVar4[0xf] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5._0_11_ = ZEXT811(0xff000000ff000000);
    auVar5._12_3_ = 0;
    auVar5[0xf] = 0xff;
    *(undefined1 (*) [16])dst_argb = auVar21 | auVar16;
    *(undefined1 (*) [16])((long)dst_argb + 0x10) = auVar33 | auVar3;
    *(undefined1 (*) [16])((long)dst_argb + 0x20) = auVar34 | auVar4;
    *(undefined1 (*) [16])((long)dst_argb + 0x30) = auVar18 | auVar5;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar9 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar9;
  } while (iVar9 != 0 && bVar2);
  return;
}

Assistant:

void SobelRow_SSE2(const uint8_t* src_sobelx,
                   const uint8_t* src_sobely,
                   uint8_t* dst_argb,
                   int width) {
  asm volatile(
      "sub         %0,%1                         \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "pslld       $0x18,%%xmm5                  \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%1,1),%%xmm1          \n"
      "lea         0x10(%0),%0                   \n"
      "paddusb     %%xmm1,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "punpcklbw   %%xmm0,%%xmm2                 \n"
      "punpckhbw   %%xmm0,%%xmm0                 \n"
      "movdqa      %%xmm2,%%xmm1                 \n"
      "punpcklwd   %%xmm2,%%xmm1                 \n"
      "punpckhwd   %%xmm2,%%xmm2                 \n"
      "por         %%xmm5,%%xmm1                 \n"
      "por         %%xmm5,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm3                 \n"
      "punpcklwd   %%xmm0,%%xmm3                 \n"
      "punpckhwd   %%xmm0,%%xmm0                 \n"
      "por         %%xmm5,%%xmm3                 \n"
      "por         %%xmm5,%%xmm0                 \n"
      "movdqu      %%xmm1,(%2)                   \n"
      "movdqu      %%xmm2,0x10(%2)               \n"
      "movdqu      %%xmm3,0x20(%2)               \n"
      "movdqu      %%xmm0,0x30(%2)               \n"
      "lea         0x40(%2),%2                   \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_sobelx),  // %0
        "+r"(src_sobely),  // %1
        "+r"(dst_argb),    // %2
        "+r"(width)        // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}